

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 3DSLoader.cpp
# Opt level: O3

void __thiscall
Assimp::Discreet3DSImporter::ParseTextureChunk(Discreet3DSImporter *this,Texture *pcOut)

{
  StreamReader<false,_false> *this_00;
  int8_t *piVar1;
  char cVar2;
  ushort uVar3;
  uint uVar4;
  Logger *pLVar5;
  uint uVar6;
  ai_real aVar7;
  float fVar8;
  double dVar9;
  Chunk chunk;
  Chunk local_5e;
  string *local_58;
  long *local_50 [2];
  long local_40 [2];
  
  if (5 < (uint)(*(int *)&this->stream->limit - *(int *)&this->stream->current)) {
    local_58 = (string *)&pcOut->mMapName;
    do {
      ReadChunk(this,&local_5e);
      if ((int)(local_5e.Size - 6) < 1) {
        uVar4 = (int)this->stream->limit - (int)this->stream->current;
      }
      else {
        this_00 = this->stream;
        uVar4 = StreamReader<false,_false>::SetReadLimit
                          (this_00,(local_5e.Size - 6) +
                                   (*(int *)&this_00->current - *(int *)&this_00->buffer));
        if (local_5e.Flag < 0xa300) {
          if (local_5e.Flag == 0x30) {
            uVar3 = StreamReader<false,_false>::Get<short>(this->stream);
            aVar7 = (float)uVar3 / 100.0;
          }
          else if (local_5e.Flag == 0x31) {
            aVar7 = StreamReader<false,_false>::Get<float>(this->stream);
          }
          else {
            if (local_5e.Flag != 0x32) goto switchD_003ed231_caseD_a352;
            dVar9 = StreamReader<false,_false>::Get<double>(this->stream);
            aVar7 = (ai_real)dVar9;
          }
          pcOut->mTextureBlend = aVar7;
        }
        else {
          switch(local_5e.Flag) {
          case 0xa351:
            uVar3 = StreamReader<false,_false>::Get<short>(this->stream);
            if ((uVar3 & 2) == 0) {
              if ((uVar3 & 0x10) == 0) {
                pcOut->mMapMode = aiTextureMapMode_Wrap;
              }
              else {
                pcOut->mMapMode = aiTextureMapMode_Decal;
              }
            }
            else {
              pcOut->mMapMode = aiTextureMapMode_Mirror;
            }
            break;
          case 0xa352:
          case 0xa353:
          case 0xa355:
          case 0xa357:
          case 0xa359:
          case 0xa35b:
            break;
          case 0xa354:
            fVar8 = StreamReader<false,_false>::Get<float>(this->stream);
            pcOut->mScaleU = fVar8;
            if ((fVar8 == 0.0) && (!NAN(fVar8))) {
              pLVar5 = DefaultLogger::get();
              Logger::warn(pLVar5,
                           "Texture coordinate scaling in the x direction is zero. Assuming 1.");
              pcOut->mScaleU = 1.0;
            }
            break;
          case 0xa356:
            fVar8 = StreamReader<false,_false>::Get<float>(this->stream);
            pcOut->mScaleV = fVar8;
            if ((fVar8 == 0.0) && (!NAN(fVar8))) {
              pLVar5 = DefaultLogger::get();
              Logger::warn(pLVar5,
                           "Texture coordinate scaling in the y direction is zero. Assuming 1.");
              pcOut->mScaleV = 1.0;
            }
            break;
          case 0xa358:
            fVar8 = StreamReader<false,_false>::Get<float>(this->stream);
            pcOut->mOffsetU = -fVar8;
            break;
          case 0xa35a:
            fVar8 = StreamReader<false,_false>::Get<float>(this->stream);
            pcOut->mOffsetV = fVar8;
            break;
          case 0xa35c:
            fVar8 = StreamReader<false,_false>::Get<float>(this->stream);
            pcOut->mRotation = fVar8 * -0.017453292;
            break;
          default:
            if (local_5e.Flag == 0xa300) {
              piVar1 = this->stream->current;
              uVar6 = 0xffffffff;
              do {
                cVar2 = StreamReader<false,_false>::Get<signed_char>(this->stream);
                uVar6 = uVar6 + 1;
              } while (cVar2 != '\0');
              local_50[0] = local_40;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_50,piVar1,piVar1 + uVar6);
              std::__cxx11::string::operator=(local_58,(string *)local_50);
              if (local_50[0] != local_40) {
                operator_delete(local_50[0],local_40[0] + 1);
              }
            }
          }
        }
switchD_003ed231_caseD_a352:
        this->stream->current = this->stream->limit;
        StreamReader<false,_false>::SetReadLimit(this->stream,uVar4);
        uVar4 = (int)this->stream->limit - (int)this->stream->current;
        if (uVar4 == 0) {
          return;
        }
      }
    } while (5 < uVar4);
  }
  return;
}

Assistant:

void Discreet3DSImporter::ParseTextureChunk(D3DS::Texture* pcOut)
{
    ASSIMP_3DS_BEGIN_CHUNK();

    // get chunk type
    switch (chunk.Flag)
    {
    case Discreet3DS::CHUNK_MAPFILE:
        {
        // The material name string is already zero-terminated, but we need to be sure ...
        const char* sz = (const char*)stream->GetPtr();
        unsigned int cnt = 0;
        while (stream->GetI1())
            ++cnt;
        pcOut->mMapName = std::string(sz,cnt);
        }
        break;


    case Discreet3DS::CHUNK_PERCENTD:
        // Manually parse the blend factor
        pcOut->mTextureBlend = ai_real( stream->GetF8() );
        break;

    case Discreet3DS::CHUNK_PERCENTF:
        // Manually parse the blend factor
        pcOut->mTextureBlend = stream->GetF4();
        break;

    case Discreet3DS::CHUNK_PERCENTW:
        // Manually parse the blend factor
        pcOut->mTextureBlend = (ai_real)((uint16_t)stream->GetI2()) / ai_real( 100.0 );
        break;

    case Discreet3DS::CHUNK_MAT_MAP_USCALE:
        // Texture coordinate scaling in the U direction
        pcOut->mScaleU = stream->GetF4();
        if (0.0f == pcOut->mScaleU)
        {
            ASSIMP_LOG_WARN("Texture coordinate scaling in the x direction is zero. Assuming 1.");
            pcOut->mScaleU = 1.0f;
        }
        break;
    case Discreet3DS::CHUNK_MAT_MAP_VSCALE:
        // Texture coordinate scaling in the V direction
        pcOut->mScaleV = stream->GetF4();
        if (0.0f == pcOut->mScaleV)
        {
            ASSIMP_LOG_WARN("Texture coordinate scaling in the y direction is zero. Assuming 1.");
            pcOut->mScaleV = 1.0f;
        }
        break;

    case Discreet3DS::CHUNK_MAT_MAP_UOFFSET:
        // Texture coordinate offset in the U direction
        pcOut->mOffsetU = -stream->GetF4();
        break;

    case Discreet3DS::CHUNK_MAT_MAP_VOFFSET:
        // Texture coordinate offset in the V direction
        pcOut->mOffsetV = stream->GetF4();
        break;

    case Discreet3DS::CHUNK_MAT_MAP_ANG:
        // Texture coordinate rotation, CCW in DEGREES
        pcOut->mRotation = -AI_DEG_TO_RAD( stream->GetF4() );
        break;

    case Discreet3DS::CHUNK_MAT_MAP_TILING:
        {
        const uint16_t iFlags = stream->GetI2();

        // Get the mapping mode (for both axes)
        if (iFlags & 0x2u)
            pcOut->mMapMode = aiTextureMapMode_Mirror;

        else if (iFlags & 0x10u)
            pcOut->mMapMode = aiTextureMapMode_Decal;

        // wrapping in all remaining cases
        else pcOut->mMapMode = aiTextureMapMode_Wrap;
        }
        break;
    };

    ASSIMP_3DS_END_CHUNK();
}